

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O2

void __thiscall thread_pool::ThreadPool::ThreadPool(ThreadPool *this,uint32_t num_threads)

{
  pointer ptVar1;
  int iVar2;
  bool bVar3;
  id local_40;
  long local_38;
  
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->thread_ids_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->thread_ids_)._M_h._M_bucket_count = 0;
  (this->thread_ids_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->thread_ids_)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->thread_ids_)._M_h._M_rehash_policy = 0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->thread_ids_)._M_h._M_buckets = &(this->thread_ids_)._M_h._M_single_bucket;
  (this->thread_ids_)._M_h._M_bucket_count = 1;
  (this->thread_ids_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->thread_ids_)._M_h._M_element_count = 0;
  (this->thread_ids_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->thread_ids_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->thread_ids_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Semaphore::Semaphore(&this->thread_semaphore_,0);
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            (&this->queue_);
  Semaphore::Semaphore(&this->queue_semaphore_,1);
  (this->terminate_)._M_base._M_i = false;
  iVar2 = num_threads + (num_threads == 0);
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    local_40._M_thread = (native_handle_type)this;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(&)(thread_pool::ThreadPool*),thread_pool::ThreadPool*>
              ((vector<std::thread,std::allocator<std::thread>> *)this,Task,(ThreadPool **)&local_40
              );
    ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_40._M_thread = ptVar1[-1]._M_id._M_thread;
    local_38 = ((long)ptVar1 -
                (long)(this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) + -1;
    std::
    _Hashtable<std::thread::id,std::pair<std::thread::id_const,unsigned_int>,std::allocator<std::pair<std::thread::id_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::thread::id>,std::hash<std::thread::id>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<std::thread::id,unsigned_long>>
              ((_Hashtable<std::thread::id,std::pair<std::thread::id_const,unsigned_int>,std::allocator<std::pair<std::thread::id_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::thread::id>,std::hash<std::thread::id>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->thread_ids_,&local_40);
  }
  return;
}

Assistant:

ThreadPool(std::uint32_t num_threads = std::thread::hardware_concurrency() / 2)  // NOLINT
      : threads_(),
        thread_ids_(),
        thread_semaphore_(0),
        queue_(),
        queue_semaphore_(1),
        terminate_(false) {
    num_threads = std::max(1U, num_threads);
    while (num_threads-- != 0) {
      threads_.emplace_back(ThreadPool::Task, this);
      thread_ids_.emplace(std::make_pair(threads_.back().get_id(), threads_.size() - 1));
    }
  }